

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int send_client_hello(ptls_t *tls,ptls_message_emitter_t *emitter,
                     ptls_handshake_properties_t *properties,ptls_iovec_t *cookie)

{
  ptls_esni_secret_t **esni;
  ptls_key_exchange_context_t **pppVar1;
  byte bVar2;
  ushort uVar3;
  ptls_key_schedule_t *ppVar4;
  ptls_context_t *ppVar5;
  ptls_cipher_suite_t *ppVar6;
  st_ptls_update_esni_key_t *psVar7;
  size_t *psVar8;
  ptls_buffer_t *buf;
  ptls_buffer_t *buf_00;
  ptls_key_exchange_algorithm_t *ppVar9;
  st_ptls_key_exchange_algorithm_t *psVar10;
  size_t sVar11;
  ptls_iovec_t *ppVar12;
  ptls_hash_algorithm_t *ppVar13;
  ptls_iovec_t pVar14;
  ptls_message_emitter_t *ppVar15;
  undefined8 ctx;
  ushort uVar16;
  int iVar17;
  int iVar18;
  ptls_early_data_acceptance_t pVar19;
  int iVar20;
  ptls_esni_secret_t *ppVar21;
  ushort *end;
  ptls_cipher_suite_t **pppVar22;
  ptls_hash_context_t *ppVar23;
  uint8_t *src;
  ptls_key_schedule_t *sched;
  uint64_t uVar24;
  size_t sVar25;
  ptls_key_exchange_algorithm_t **pppVar26;
  long lVar27;
  ushort *puVar28;
  size_t sVar29;
  long lVar30;
  size_t sVar31;
  ulong uVar32;
  ushort *puVar33;
  ushort *puVar34;
  size_t len;
  ulong uVar35;
  size_t delta;
  uint8_t *puVar36;
  bool bVar37;
  ptls_iovec_t ikm;
  char *local_150;
  long local_148;
  ushort *local_140;
  size_t local_138;
  ushort *local_120;
  ptls_message_emitter_t *local_118;
  undefined1 local_10c;
  undefined1 local_10b;
  ushort local_10a;
  ushort local_108;
  ushort local_106;
  undefined1 local_104;
  ushort local_103;
  undefined1 local_101;
  ushort *local_100;
  ptls_key_exchange_algorithm_t **local_f8;
  anon_struct_104_5_dae46d3e_for_client *local_f0;
  size_t local_e8;
  ptls_buffer_t *local_e0;
  ptls_iovec_t *local_d8;
  size_t local_d0;
  uint64_t not_before;
  uint32_t max_early_data_size;
  uint32_t age_add;
  undefined1 local_b8;
  undefined1 local_b7;
  undefined1 local_b6;
  undefined1 local_b5;
  undefined2 local_b4;
  undefined2 local_b2;
  undefined2 local_b0;
  undefined2 local_ae;
  undefined2 local_ac;
  undefined2 local_aa;
  undefined2 local_a8;
  undefined2 local_a6;
  undefined2 local_a4;
  undefined2 local_a2;
  undefined2 local_a0;
  undefined2 local_9e;
  undefined2 local_9c;
  undefined2 local_9a;
  ptls_iovec_t resumption_ticket;
  uint64_t not_after;
  char *local_80;
  uint8_t binder_key [64];
  
  ppVar4 = tls->key_schedule;
  local_d8 = cookie;
  if (tls->server_name == (char *)0x0) {
    bVar37 = false;
  }
  else {
    iVar17 = ptls_server_name_is_ipaddr(tls->server_name);
    bVar37 = iVar17 == 0;
  }
  local_118 = emitter;
  if (properties != (ptls_handshake_properties_t *)0x0) {
    iVar17 = 0;
    if ((bool)(ppVar4 == (ptls_key_schedule_t *)0x0 & bVar37)) {
      puVar33 = (ushort *)(properties->field_0).client.esni_keys.base;
      if (puVar33 != (ushort *)0x0) {
        ppVar5 = tls->ctx;
        uVar32 = (properties->field_0).client.esni_keys.len;
        ppVar21 = (ptls_esni_secret_t *)calloc(1,0xd0);
        tls->esni = ppVar21;
        if (ppVar21 == (ptls_esni_secret_t *)0x0) {
          iVar18 = 0x201;
          local_150 = (char *)0x0;
          goto LAB_0010afc1;
        }
        esni = &tls->esni;
        if (((1 < (long)uVar32) && ((ushort)(*puVar33 << 8 | *puVar33 >> 8) == 0xff02)) &&
           (5 < uVar32)) {
          local_f8 = (ptls_key_exchange_algorithm_t **)tls->client_random;
          local_f0 = &ppVar21->client;
          local_e0 = (ptls_buffer_t *)&(ppVar21->client).cipher;
          end = (ushort *)(uVar32 + (long)puVar33);
          for (pppVar22 = ppVar5->cipher_suites; ppVar6 = *pppVar22,
              ppVar6 != (ptls_cipher_suite_t *)0x0; pppVar22 = pppVar22 + 1) {
            if ((ppVar6->id | 2) == 0x1303) {
              ppVar23 = (*ppVar6->hash->create)();
              if (ppVar23 != (ptls_hash_context_t *)0x0) {
                (*ppVar23->update)(ppVar23,puVar33,2);
                (*ppVar23->update)(ppVar23,"",4);
                local_100 = (ushort *)(uVar32 - 6);
                (*ppVar23->update)(ppVar23,puVar33 + 3);
                (*ppVar23->final)(ppVar23,binder_key,PTLS_HASH_FINAL_MODE_FREE);
                if (((*(int *)(puVar33 + 1) == binder_key._0_4_) &&
                    (ppVar21->version = 0xff02, (ushort *)0x1 < local_100)) &&
                   (uVar35 = (ulong)(ushort)(puVar33[3] << 8 | puVar33[3] >> 8),
                   uVar35 <= uVar32 - 8)) {
                  local_150 = (char *)malloc(uVar35 + 1);
                  if (local_150 == (char *)0x0) {
                    local_150 = (char *)0x0;
                    goto LAB_0010ad55;
                  }
                  puVar34 = (ushort *)((long)(puVar33 + 4) + uVar35);
                  if (uVar35 != 0) {
                    local_100 = puVar34;
                    memcpy(local_150,puVar33 + 4,uVar35);
                    puVar34 = local_100;
                  }
                  local_150[uVar35] = '\0';
                  if ((ulong)((long)end - (long)puVar34) < 2) goto LAB_0010ad55;
                  uVar35 = (ulong)(ushort)(*puVar34 << 8 | *puVar34 >> 8);
                  local_120 = puVar34 + 1;
                  if ((ulong)((long)end - (long)local_120) < uVar35) goto LAB_0010ad55;
                  puVar34 = (ushort *)((long)local_120 + uVar35);
                  iVar18 = select_key_share(&local_f0->key_share,&resumption_ticket,
                                            ppVar5->key_exchanges,(uint8_t **)&local_120,
                                            (uint8_t *)puVar34,0);
                  if (((iVar18 != 0) || (local_120 != puVar34)) ||
                     ((ulong)((long)end - (long)puVar34) < 2)) goto LAB_0010ad55;
                  uVar35 = (ulong)(ushort)(*local_120 << 8 | *local_120 >> 8);
                  puVar34 = local_120 + 1;
                  if ((ulong)((long)end - (long)puVar34) < uVar35) goto LAB_0010ad55;
                  puVar28 = (ushort *)(uVar35 + (long)puVar34);
                  iVar18 = select_cipher((ptls_cipher_suite_t **)local_e0,ppVar5->cipher_suites,
                                         (uint8_t *)puVar34,(uint8_t *)puVar28);
                  if ((iVar18 != 0) || ((long)end - (long)puVar28 < 2)) goto LAB_0010ad55;
                  (ppVar21->client).padded_length = *puVar28 << 8 | *puVar28 >> 8;
                  local_120 = puVar28 + 1;
                  iVar18 = ptls_decode64(&not_before,(uint8_t **)&local_120,(uint8_t *)end);
                  if ((iVar18 != 0) ||
                     ((iVar18 = ptls_decode64(&not_after,(uint8_t **)&local_120,(uint8_t *)end),
                      iVar18 != 0 || ((ulong)((long)end - (long)local_120) < 2))))
                  goto LAB_0010ad55;
                  uVar35 = (ulong)(ushort)(*local_120 << 8 | *local_120 >> 8);
                  puVar34 = local_120 + 1;
                  if ((ulong)((long)end - (long)puVar34) < uVar35) goto LAB_0010ad55;
                  puVar28 = (ushort *)(uVar35 + (long)puVar34);
                  goto LAB_0010b7fa;
                }
              }
              break;
            }
          }
        }
        local_150 = (char *)0x0;
        goto LAB_0010ad55;
      }
      local_150 = (char *)0x0;
    }
    else {
      local_150 = (char *)0x0;
    }
    goto LAB_0010ada0;
  }
  local_140 = (ushort *)0x0;
  uVar32 = 0;
  local_150 = (char *)0x0;
  iVar17 = 0;
  iVar20 = 0;
  if (tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) goto LAB_0010ae9b;
LAB_0010aeaf:
  if (ppVar4 == (ptls_key_schedule_t *)0x0) {
    sched = key_schedule_new(tls->cipher_suite,tls->ctx->cipher_suites,
                             tls->ctx->hkdf_label_prefix__obsolete);
    tls->key_schedule = sched;
    ikm.len = uVar32;
    ikm.base = (uint8_t *)local_140;
    iVar18 = key_schedule_extract(sched,ikm);
    if (iVar18 != 0) goto LAB_0010afc1;
  }
  ppVar15 = local_118;
  lVar30 = local_118->record_header_length + local_118->buf->off;
  iVar18 = (*local_118->begin_message)(local_118);
  if (iVar18 == 0) {
    buf = ppVar15->buf;
    local_101 = 1;
    iVar18 = ptls_buffer__do_pushv(buf,&local_101,1);
    if ((iVar18 == 0) && (iVar18 = ptls_buffer__do_pushv(buf,"",3), iVar18 == 0)) {
      local_f0 = (anon_struct_104_5_dae46d3e_for_client *)buf->off;
      buf_00 = local_118->buf;
      local_9a = 0x303;
      iVar18 = ptls_buffer__do_pushv(buf_00,&local_9a,2);
      if ((iVar18 == 0) &&
         ((local_e0 = buf, iVar18 = ptls_buffer__do_pushv(buf_00,tls->client_random,0x20),
          iVar18 == 0 && (iVar18 = ptls_buffer__do_pushv(buf_00,"",1), iVar18 == 0)))) {
        sVar31 = buf_00->off;
        iVar18 = ptls_buffer__do_pushv
                           (buf_00,(tls->field_18).client.legacy_session_id.base,
                            (tls->field_18).client.legacy_session_id.len);
        if (iVar18 == 0) {
          buf_00->base[sVar31 - 1] = (char)(int)buf_00->off - (char)sVar31;
          iVar18 = ptls_buffer__do_pushv(buf_00,"",2);
          if (iVar18 == 0) {
            local_f8 = (ptls_key_exchange_algorithm_t **)0x10;
            sVar31 = buf_00->off;
            pppVar22 = tls->ctx->cipher_suites;
            do {
              if (*pppVar22 == (ptls_cipher_suite_t *)0x0) {
                lVar27 = buf_00->off - sVar31;
                buf_00->base[sVar31 - 2] = (uint8_t)((ulong)lVar27 >> 8);
                buf_00->base[sVar31 - 1] = (uint8_t)lVar27;
                iVar18 = ptls_buffer__do_pushv(buf_00,"",1);
                if (iVar18 != 0) break;
                sVar31 = buf_00->off;
                local_104 = 0;
                iVar18 = ptls_buffer__do_pushv(buf_00,&local_104,1);
                if (iVar18 != 0) break;
                buf_00->base[sVar31 - 1] = (char)(int)buf_00->off - (char)sVar31;
                iVar18 = ptls_buffer__do_pushv(buf_00,"",2);
                if (iVar18 != 0) break;
                local_100 = (ushort *)buf_00->off;
                local_9c = 0x3300;
                iVar18 = ptls_buffer__do_pushv(buf_00,&local_9c,2);
                if ((iVar18 != 0) || (iVar18 = ptls_buffer__do_pushv(buf_00,"",2), iVar18 != 0))
                break;
                local_e8 = buf_00->off;
                iVar18 = ptls_buffer__do_pushv(buf_00,"",2);
                if (iVar18 != 0) break;
                sVar31 = buf_00->off;
                psVar10 = tls->key_share;
                sVar25 = sVar31;
                if (psVar10 != (st_ptls_key_exchange_algorithm_t *)0x0) {
                  pppVar1 = &(tls->field_18).client.key_share_ctx;
                  iVar18 = (*psVar10->create)(psVar10,pppVar1);
                  if ((iVar18 != 0) ||
                     (iVar18 = push_key_share_entry(buf_00,tls->key_share->id,(*pppVar1)->pubkey),
                     iVar18 != 0)) break;
                  sVar25 = buf_00->off;
                }
                buf_00->base[sVar31 - 2] = (uint8_t)(sVar25 - sVar31 >> 8);
                buf_00->base[sVar31 - 1] = (uint8_t)(sVar25 - sVar31);
                sVar31 = buf_00->off - local_e8;
                buf_00->base[local_e8 - 2] = (uint8_t)(sVar31 >> 8);
                buf_00->base[local_e8 - 1] = (uint8_t)sVar31;
                if (bVar37) {
                  if (tls->esni == (ptls_esni_secret_t *)0x0) {
                    local_a2 = 0;
                    iVar18 = ptls_buffer__do_pushv(buf_00,&local_a2,2);
                    if ((iVar18 != 0) || (iVar18 = ptls_buffer__do_pushv(buf_00,"",2), iVar18 != 0))
                    break;
                    sVar25 = buf_00->off;
                    iVar18 = emit_server_name_extension(buf_00,tls->server_name);
                  }
                  else {
                    if (local_150 != (char *)0x0) {
                      local_9e = 0;
                      iVar18 = ptls_buffer__do_pushv(buf_00,&local_9e,2);
                      if ((iVar18 != 0) ||
                         (iVar18 = ptls_buffer__do_pushv(buf_00,"",2), iVar18 != 0)) break;
                      sVar25 = buf_00->off;
                      iVar18 = emit_server_name_extension(buf_00,local_150);
                      if (iVar18 != 0) break;
                      lVar27 = buf_00->off - sVar25;
                      buf_00->base[sVar25 - 2] = (uint8_t)((ulong)lVar27 >> 8);
                      buf_00->base[sVar25 - 1] = (uint8_t)lVar27;
                    }
                    local_a0 = 0xceff;
                    iVar18 = ptls_buffer__do_pushv(buf_00,&local_a0,2);
                    if ((iVar18 != 0) || (iVar18 = ptls_buffer__do_pushv(buf_00,"",2), iVar18 != 0))
                    break;
                    sVar25 = buf_00->off;
                    local_80 = tls->server_name;
                    ppVar21 = tls->esni;
                    binder_key[0] = '\0';
                    binder_key[1] = '\0';
                    binder_key[2] = '\0';
                    binder_key[3] = '\0';
                    binder_key[4] = '\0';
                    binder_key[5] = '\0';
                    binder_key[6] = '\0';
                    binder_key[7] = '\0';
                    iVar18 = create_esni_aead((ptls_aead_context_t **)binder_key,1,
                                              (ppVar21->client).cipher,ppVar21->secret,
                                              ppVar21->esni_contents_hash);
                    if (iVar18 == 0) {
                      uVar16 = ((ppVar21->client).cipher)->id;
                      local_120 = (ushort *)CONCAT62(local_120._2_6_,uVar16 << 8 | uVar16 >> 8);
                      iVar18 = ptls_buffer__do_pushv(buf_00,&local_120,2);
                      if (((iVar18 == 0) &&
                          (iVar18 = push_key_share_entry
                                              (buf_00,((ppVar21->client).key_share)->id,
                                               (ppVar21->client).pubkey), iVar18 == 0)) &&
                         (iVar18 = ptls_buffer__do_pushv(buf_00,"",2), iVar18 == 0)) {
                        sVar11 = buf_00->off;
                        iVar18 = ptls_buffer__do_pushv
                                           (buf_00,(ppVar21->client).record_digest,
                                            ((ppVar21->client).cipher)->hash->digest_size);
                        if (iVar18 == 0) {
                          lVar27 = buf_00->off - sVar11;
                          buf_00->base[sVar11 - 2] = (uint8_t)((ulong)lVar27 >> 8);
                          buf_00->base[sVar11 - 1] = (uint8_t)lVar27;
                          iVar18 = ptls_buffer__do_pushv(buf_00,"",2);
                          if (iVar18 == 0) {
                            local_d0 = buf_00->off;
                            iVar18 = ptls_buffer__do_pushv(buf_00,ppVar21->nonce,0x10);
                            if ((iVar18 == 0) &&
                               (iVar18 = emit_server_name_extension(buf_00,local_80), iVar18 == 0))
                            {
                              uVar32 = buf_00->off - local_d0;
                              uVar35 = (ulong)(ppVar21->client).padded_length + 0x10;
                              delta = uVar35 - uVar32;
                              if (uVar32 <= uVar35 && delta != 0) {
                                iVar18 = ptls_buffer_reserve(buf_00,delta);
                                if (iVar18 != 0) goto LAB_0010b6d5;
                                memset(buf_00->base + buf_00->off,0,delta);
                                buf_00->off = buf_00->off + delta;
                              }
                              ctx = binder_key._0_8_;
                              iVar18 = ptls_buffer_reserve(buf_00,*(size_t *)
                                                                   (*(long *)binder_key._0_8_ + 0x28
                                                                   ));
                              if (iVar18 == 0) {
                                puVar36 = buf_00->base + local_d0;
                                iVar18 = 0;
                                ptls_aead_encrypt((ptls_aead_context_t *)ctx,puVar36,puVar36,
                                                  buf_00->off - local_d0,0,buf_00->base + local_e8,
                                                  sVar31);
                                sVar31 = buf_00->off + *(long *)(*(long *)ctx + 0x28);
                                buf_00->off = sVar31;
                                lVar27 = sVar31 - local_d0;
                                buf_00->base[local_d0 - 2] = (uint8_t)((ulong)lVar27 >> 8);
                                buf_00->base[local_d0 - 1] = (uint8_t)lVar27;
                              }
                            }
                          }
                        }
                      }
                    }
LAB_0010b6d5:
                    if (binder_key._0_8_ != 0) {
                      ptls_aead_free((ptls_aead_context_t *)binder_key._0_8_);
                    }
                  }
                  if (iVar18 != 0) break;
                  lVar27 = buf_00->off - sVar25;
                  buf_00->base[sVar25 - 2] = (uint8_t)((ulong)lVar27 >> 8);
                  buf_00->base[sVar25 - 1] = (uint8_t)lVar27;
                }
                if ((properties == (ptls_handshake_properties_t *)0x0) ||
                   ((properties->field_0).client.negotiated_protocols.count == 0))
                goto LAB_0010badf;
                local_a4 = 0x1000;
                iVar18 = ptls_buffer__do_pushv(buf_00,&local_a4,2);
                if ((iVar18 == 0) && (iVar18 = ptls_buffer__do_pushv(buf_00,"",2), iVar18 == 0)) {
                  local_e8 = buf_00->off;
                  iVar18 = ptls_buffer__do_pushv(buf_00,"",2);
                  if (iVar18 == 0) {
                    sVar31 = buf_00->off;
                    lVar27 = 8;
                    local_138 = 0;
                    goto LAB_0010ba3e;
                  }
                }
                break;
              }
              uVar16 = (*pppVar22)->id;
              local_103 = uVar16 << 8 | uVar16 >> 8;
              iVar18 = ptls_buffer__do_pushv(buf_00,&local_103,2);
              pppVar22 = pppVar22 + 1;
            } while (iVar18 == 0);
          }
        }
      }
    }
  }
LAB_0010afc1:
  free(local_150);
  (*ptls_clear_memory)(binder_key,0x40);
  return iVar18;
LAB_0010b7fa:
  if (puVar34 == puVar28) goto LAB_0010b840;
  if (((long)puVar28 - (long)puVar34 < 2) || (((long)puVar28 - (long)puVar34) - 2U < 2))
  goto LAB_0010ad55;
  uVar35 = (ulong)(ushort)(puVar34[1] << 8 | puVar34[1] >> 8);
  if ((ulong)((long)puVar28 - (long)(puVar34 + 2)) < uVar35) goto LAB_0010ad55;
  puVar34 = (ushort *)((long)(puVar34 + 2) + uVar35);
  goto LAB_0010b7fa;
LAB_0010b840:
  if (((puVar28 == end) &&
      (uVar24 = (*ppVar5->get_time->cb)(ppVar5->get_time),
      not_before * 1000 < uVar24 || not_before * 1000 - uVar24 == 0)) &&
     (uVar24 <= not_after * 1000)) {
    (*ppVar5->random_bytes)((*esni)->nonce,0x10);
    iVar18 = ptls_calc_hash((((*esni)->client).cipher)->hash,((*esni)->client).record_digest,puVar33
                            ,uVar32);
    if (iVar18 == 0) {
      ppVar21 = *esni;
      psVar10 = (ppVar21->client).key_share;
      pVar14.len = resumption_ticket.len;
      pVar14.base = resumption_ticket.base;
      iVar18 = (*psVar10->exchange)(psVar10,&(ppVar21->client).pubkey,&ppVar21->secret,pVar14);
      if (iVar18 == 0) {
        ppVar21 = *esni;
        iVar18 = build_esni_contents_hash
                           (((ppVar21->client).cipher)->hash,ppVar21->esni_contents_hash,
                            (ppVar21->client).record_digest,((ppVar21->client).key_share)->id,
                            (ppVar21->client).pubkey,(uint8_t *)local_f8);
        if (iVar18 == 0) goto LAB_0010ad65;
      }
    }
    free_esni_secret(esni,0);
    goto LAB_0010afc1;
  }
LAB_0010ad55:
  free(*esni);
  *esni = (ptls_esni_secret_t *)0x0;
LAB_0010ad65:
  psVar7 = tls->ctx->update_esni_key;
  if (psVar7 != (st_ptls_update_esni_key_t *)0x0) {
    ppVar21 = tls->esni;
    iVar18 = (*psVar7->cb)(psVar7,tls,ppVar21->secret,((ppVar21->client).cipher)->hash,
                           ppVar21->esni_contents_hash);
    if (iVar18 != 0) goto LAB_0010afc1;
  }
LAB_0010ada0:
  puVar33 = (ushort *)(properties->field_0).client.session_ticket.base;
  if (puVar33 == (ushort *)0x0) {
    local_140 = (ushort *)0x0;
    uVar32 = 0;
  }
  else {
    puVar36 = (uint8_t *)((properties->field_0).client.session_ticket.len + (long)puVar33);
    local_120 = puVar33;
    iVar17 = ptls_decode64(&not_before,(uint8_t **)&local_120,puVar36);
    if (((iVar17 == 0) && (1 < (long)puVar36 - (long)local_120)) &&
       ((1 < ((long)puVar36 - (long)local_120) + -2 &&
        (2 < (ulong)((long)puVar36 - (long)(local_120 + 2)))))) {
      uVar16 = *local_120;
      uVar3 = local_120[1];
      lVar30 = 0;
      uVar32 = 0;
      do {
        uVar32 = (ulong)*(byte *)((long)(local_120 + 2) + lVar30) | uVar32 << 8;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      src = (uint8_t *)((long)local_120 + 7);
      if (uVar32 <= (ulong)((long)puVar36 - (long)src)) {
        puVar33 = (ushort *)(src + uVar32);
        iVar17 = decode_new_session_ticket
                           (tls,(uint32_t *)&not_after,&age_add,(ptls_iovec_t *)binder_key,
                            &resumption_ticket,&max_early_data_size,src,(uint8_t *)puVar33);
        if ((1 < (ulong)((long)puVar36 - (long)puVar33)) && (iVar17 == 0)) {
          uVar32 = (ulong)(ushort)(*puVar33 << 8 | *puVar33 >> 8);
          local_140 = puVar33 + 1;
          if ((uint8_t *)((long)puVar33 + uVar32 + 2) == puVar36 &&
              uVar32 <= (ulong)((long)puVar36 - (long)local_140)) {
            ppVar5 = tls->ctx;
            pppVar26 = ppVar5->key_exchanges;
            do {
              ppVar9 = *pppVar26;
              if (ppVar9 == (ptls_key_exchange_algorithm_t *)0x0) goto LAB_0010ae42;
              pppVar26 = pppVar26 + 1;
            } while (ppVar9->id != (uint16_t)(uVar16 << 8 | uVar16 >> 8));
            pppVar22 = ppVar5->cipher_suites;
            do {
              ppVar6 = *pppVar22;
              if (ppVar6 == (ptls_cipher_suite_t *)0x0) goto LAB_0010ae42;
              pppVar22 = pppVar22 + 1;
            } while (ppVar6->id != (uint16_t)(uVar3 << 8 | uVar3 >> 8));
            uVar24 = (*ppVar5->get_time->cb)(ppVar5->get_time);
            if ((not_before <= uVar24) && (uVar24 - not_before < 0x240c8400)) {
              bVar2 = (tls->field_18).server.pending_traffic_secret[0x38];
              iVar17 = (int)(uVar24 - not_before) + age_add;
              (tls->field_18).server.pending_traffic_secret[0x38] = bVar2 | 1;
              if (tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) {
                tls->key_share = ppVar9;
              }
              tls->cipher_suite = ppVar6;
              if ((max_early_data_size != 0 && ppVar4 == (ptls_key_schedule_t *)0x0) &&
                 ((properties->field_0).client.max_early_data_size != (size_t *)0x0)) {
                (tls->field_18).server.pending_traffic_secret[0x38] = bVar2 | 3;
                *(properties->field_0).client.max_early_data_size = (ulong)max_early_data_size;
              }
              goto LAB_0010ae60;
            }
          }
        }
      }
    }
LAB_0010ae42:
    iVar17 = 0;
    local_140 = (ushort *)0x0;
    uVar32 = 0;
  }
LAB_0010ae60:
  pVar19 = PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN;
  if (((tls->field_18).server.pending_traffic_secret[0x38] & 2) == 0) {
    psVar8 = (properties->field_0).client.max_early_data_size;
    pVar19 = PTLS_EARLY_DATA_REJECTED;
    if (psVar8 != (size_t *)0x0) {
      *psVar8 = 0;
    }
  }
  (properties->field_0).client.early_data_acceptance = pVar19;
  iVar20 = iVar17;
  if ((tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) &&
     (((properties->field_0).server.selected_psk_binder.base[0x2c] & 1) == 0)) {
LAB_0010ae9b:
    tls->key_share = *tls->ctx->key_exchanges;
    iVar20 = iVar17;
  }
  goto LAB_0010aeaf;
LAB_0010ba3e:
  if (local_138 == (properties->field_0).client.negotiated_protocols.count) goto LAB_0010baa4;
  iVar18 = ptls_buffer__do_pushv(buf_00,"",1);
  if (iVar18 != 0) goto LAB_0010afc1;
  sVar25 = buf_00->off;
  ppVar12 = (properties->field_0).client.negotiated_protocols.list;
  iVar18 = ptls_buffer__do_pushv
                     (buf_00,*(void **)((long)ppVar12 + lVar27 + -8),
                      *(size_t *)((long)&ppVar12->base + lVar27));
  if (iVar18 != 0) goto LAB_0010afc1;
  buf_00->base[sVar25 - 1] = (char)(int)buf_00->off - (char)sVar25;
  local_138 = local_138 + 1;
  lVar27 = lVar27 + 0x10;
  goto LAB_0010ba3e;
LAB_0010baa4:
  lVar27 = buf_00->off - sVar31;
  buf_00->base[sVar31 - 2] = (uint8_t)((ulong)lVar27 >> 8);
  buf_00->base[sVar31 - 1] = (uint8_t)lVar27;
  lVar27 = buf_00->off - local_e8;
  buf_00->base[local_e8 - 2] = (uint8_t)((ulong)lVar27 >> 8);
  buf_00->base[local_e8 - 1] = (uint8_t)lVar27;
LAB_0010badf:
  if (tls->ctx->decompress_certificate != (ptls_decompress_certificate_t *)0x0) {
    local_a6 = 0x1b00;
    iVar18 = ptls_buffer__do_pushv(buf_00,&local_a6,2);
    if ((iVar18 != 0) || (iVar18 = ptls_buffer__do_pushv(buf_00,"",2), iVar18 != 0))
    goto LAB_0010afc1;
    sVar31 = buf_00->off;
    iVar18 = ptls_buffer__do_pushv(buf_00,"",1);
    if (iVar18 != 0) goto LAB_0010afc1;
    puVar33 = tls->ctx->decompress_certificate->supported_algorithms;
    uVar16 = *puVar33;
    if (uVar16 == 0xffff) {
      __assert_fail("*algo != UINT16_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                    ,0x7f4,
                    "int send_client_hello(ptls_t *, ptls_message_emitter_t *, ptls_handshake_properties_t *, ptls_iovec_t *)"
                   );
    }
    sVar25 = buf_00->off;
    while (puVar33 = puVar33 + 1, uVar16 != 0xffff) {
      local_106 = uVar16 << 8 | uVar16 >> 8;
      iVar18 = ptls_buffer__do_pushv(buf_00,&local_106,2);
      if (iVar18 != 0) goto LAB_0010afc1;
      uVar16 = *puVar33;
    }
    buf_00->base[sVar25 - 1] = (char)(int)buf_00->off - (char)sVar25;
    lVar27 = buf_00->off - sVar31;
    buf_00->base[sVar31 - 2] = (uint8_t)((ulong)lVar27 >> 8);
    buf_00->base[sVar31 - 1] = (uint8_t)lVar27;
  }
  local_a8 = 0x2b00;
  iVar18 = ptls_buffer__do_pushv(buf_00,&local_a8,2);
  if ((iVar18 == 0) && (iVar18 = ptls_buffer__do_pushv(buf_00,"",2), iVar18 == 0)) {
    sVar31 = buf_00->off;
    iVar18 = ptls_buffer__do_pushv(buf_00,"",1);
    if (iVar18 == 0) {
      sVar25 = buf_00->off;
      lVar27 = 0;
      do {
        if (lVar27 == 8) {
          buf_00->base[sVar25 - 1] = (char)(int)buf_00->off - (char)sVar25;
          lVar27 = buf_00->off - sVar31;
          buf_00->base[sVar31 - 2] = (uint8_t)((ulong)lVar27 >> 8);
          buf_00->base[sVar31 - 1] = (uint8_t)lVar27;
          local_aa = 0xd00;
          iVar18 = ptls_buffer__do_pushv(buf_00,&local_aa,2);
          if ((iVar18 == 0) && (iVar18 = ptls_buffer__do_pushv(buf_00,"",2), iVar18 == 0)) {
            sVar31 = buf_00->off;
            iVar18 = push_signature_algorithms(buf_00);
            if (iVar18 == 0) {
              lVar27 = buf_00->off - sVar31;
              buf_00->base[sVar31 - 2] = (uint8_t)((ulong)lVar27 >> 8);
              buf_00->base[sVar31 - 1] = (uint8_t)lVar27;
              local_ac = 0xa00;
              iVar18 = ptls_buffer__do_pushv(buf_00,&local_ac,2);
              if ((iVar18 == 0) && (iVar18 = ptls_buffer__do_pushv(buf_00,"",2), iVar18 == 0)) {
                sVar31 = buf_00->off;
                pppVar26 = tls->ctx->key_exchanges;
                iVar18 = ptls_buffer__do_pushv(buf_00,"",2);
                if (iVar18 == 0) {
                  sVar25 = buf_00->off;
                  goto LAB_0010bd95;
                }
              }
            }
          }
          break;
        }
        local_108 = *(ushort *)((long)supported_versions + lVar27) << 8 |
                    *(ushort *)((long)supported_versions + lVar27) >> 8;
        iVar18 = ptls_buffer__do_pushv(buf_00,&local_108,2);
        lVar27 = lVar27 + 2;
      } while (iVar18 == 0);
    }
  }
  goto LAB_0010afc1;
  while( true ) {
    uVar16 = (*pppVar26)->id;
    local_10a = uVar16 << 8 | uVar16 >> 8;
    iVar18 = ptls_buffer__do_pushv(buf_00,&local_10a,2);
    pppVar26 = pppVar26 + 1;
    if (iVar18 != 0) break;
LAB_0010bd95:
    if (*pppVar26 == (ptls_key_exchange_algorithm_t *)0x0) {
      lVar27 = buf_00->off - sVar25;
      buf_00->base[sVar25 - 2] = (uint8_t)((ulong)lVar27 >> 8);
      buf_00->base[sVar25 - 1] = (uint8_t)lVar27;
      lVar27 = buf_00->off - sVar31;
      buf_00->base[sVar31 - 2] = (uint8_t)((ulong)lVar27 >> 8);
      buf_00->base[sVar31 - 1] = (uint8_t)lVar27;
      if ((local_d8 != (ptls_iovec_t *)0x0) && (local_d8->base != (uint8_t *)0x0)) {
        local_ae = 0x2c00;
        iVar18 = ptls_buffer__do_pushv(buf_00,&local_ae,2);
        if ((iVar18 != 0) || (iVar18 = ptls_buffer__do_pushv(buf_00,"",2), iVar18 != 0)) break;
        sVar31 = buf_00->off;
        iVar18 = ptls_buffer__do_pushv(buf_00,"",2);
        if (iVar18 != 0) break;
        sVar25 = buf_00->off;
        iVar18 = ptls_buffer__do_pushv(buf_00,local_d8->base,local_d8->len);
        if (iVar18 != 0) break;
        lVar27 = buf_00->off - sVar25;
        buf_00->base[sVar25 - 2] = (uint8_t)((ulong)lVar27 >> 8);
        buf_00->base[sVar25 - 1] = (uint8_t)lVar27;
        lVar27 = buf_00->off - sVar31;
        buf_00->base[sVar31 - 2] = (uint8_t)((ulong)lVar27 >> 8);
        buf_00->base[sVar31 - 1] = (uint8_t)lVar27;
      }
      iVar18 = push_additional_extensions(properties,buf_00);
      if (iVar18 != 0) break;
      if (tls->ctx->save_ticket == (ptls_save_ticket_t *)0x0 && local_140 == (ushort *)0x0)
      goto LAB_0010c1c7;
      local_b0 = 0x2d00;
      iVar18 = ptls_buffer__do_pushv(buf_00,&local_b0,2);
      if ((iVar18 != 0) || (iVar18 = ptls_buffer__do_pushv(buf_00,"",2), iVar18 != 0)) break;
      sVar31 = buf_00->off;
      iVar18 = ptls_buffer__do_pushv(buf_00,"",1);
      if (iVar18 != 0) break;
      sVar25 = buf_00->off;
      if ((tls->ctx->field_0x70 & 1) == 0) {
        local_10b = 0;
        iVar18 = ptls_buffer__do_pushv(buf_00,&local_10b,1);
        if (iVar18 != 0) break;
      }
      local_10c = 1;
      iVar18 = ptls_buffer__do_pushv(buf_00,&local_10c,1);
      if (iVar18 == 0) {
        buf_00->base[sVar25 - 1] = (char)(int)buf_00->off - (char)sVar25;
        lVar27 = buf_00->off - sVar31;
        buf_00->base[sVar31 - 2] = (uint8_t)((ulong)lVar27 >> 8);
        buf_00->base[sVar31 - 1] = (uint8_t)lVar27;
        if (local_140 == (ushort *)0x0) goto LAB_0010c1c7;
        if (((tls->field_18).server.pending_traffic_secret[0x38] & 2) == 0 ||
            ppVar4 != (ptls_key_schedule_t *)0x0) goto LAB_0010c00b;
        local_b2 = 0x2a00;
        iVar18 = ptls_buffer__do_pushv(buf_00,&local_b2,2);
        if ((iVar18 == 0) && (iVar18 = ptls_buffer__do_pushv(buf_00,"",2), iVar18 == 0)) {
          sVar31 = buf_00->off;
          for (lVar27 = -2; lVar27 != 0; lVar27 = lVar27 + 1) {
            buf_00->base[lVar27 + sVar31] = '\0';
          }
LAB_0010c00b:
          local_b4 = 0x2900;
          iVar18 = ptls_buffer__do_pushv(buf_00,&local_b4,2);
          if ((iVar18 == 0) && (iVar18 = ptls_buffer__do_pushv(buf_00,"",2), iVar18 == 0)) {
            sVar31 = buf_00->off;
            iVar18 = ptls_buffer__do_pushv(buf_00,"",2);
            if (iVar18 == 0) {
              sVar25 = buf_00->off;
              iVar18 = ptls_buffer__do_pushv(buf_00,"",2);
              if (iVar18 != 0) break;
              sVar11 = buf_00->off;
              iVar18 = ptls_buffer__do_pushv(buf_00,resumption_ticket.base,resumption_ticket.len);
              if (iVar18 == 0) {
                lVar27 = buf_00->off - sVar11;
                buf_00->base[sVar11 - 2] = (uint8_t)((ulong)lVar27 >> 8);
                buf_00->base[sVar11 - 1] = (uint8_t)lVar27;
                local_b8 = (undefined1)((uint)iVar20 >> 0x18);
                local_b7 = (undefined1)((uint)iVar20 >> 0x10);
                local_b6 = (undefined1)((uint)iVar20 >> 8);
                local_b5 = (undefined1)iVar20;
                iVar18 = ptls_buffer__do_pushv(buf_00,&local_b8,4);
                if (iVar18 == 0) {
                  lVar27 = buf_00->off - sVar25;
                  buf_00->base[sVar25 - 2] = (uint8_t)((ulong)lVar27 >> 8);
                  buf_00->base[sVar25 - 1] = (uint8_t)lVar27;
                  iVar18 = ptls_buffer__do_pushv(buf_00,"",2);
                  if (iVar18 == 0) {
                    sVar25 = buf_00->off;
                    iVar18 = ptls_buffer__do_pushv(buf_00,"",1);
                    if (iVar18 == 0) {
                      sVar11 = buf_00->off;
                      iVar18 = ptls_buffer_reserve(buf_00,(tls->key_schedule->hashes[0].algo)->
                                                          digest_size);
                      if (iVar18 == 0) {
                        sVar29 = buf_00->off + (tls->key_schedule->hashes[0].algo)->digest_size;
                        buf_00->off = sVar29;
                        buf_00->base[sVar11 - 1] = (char)sVar29 - (char)sVar11;
                        lVar27 = buf_00->off - sVar25;
                        buf_00->base[sVar25 - 2] = (uint8_t)((ulong)lVar27 >> 8);
                        buf_00->base[sVar25 - 1] = (uint8_t)lVar27;
                        lVar27 = buf_00->off - sVar31;
                        buf_00->base[sVar31 - 2] = (uint8_t)((ulong)lVar27 >> 8);
                        buf_00->base[sVar31 - 1] = (uint8_t)lVar27;
LAB_0010c1c7:
                        lVar27 = buf_00->off - (long)local_100;
                        (buf_00->base + -2)[(long)local_100] = (uint8_t)((ulong)lVar27 >> 8);
                        (buf_00->base + -1)[(long)local_100] = (uint8_t)lVar27;
                        uVar32 = local_e0->off - (long)local_f0;
                        for (; local_f8 != (ptls_key_exchange_algorithm_t **)0xfffffffffffffff8;
                            local_f8 = local_f8 + -1) {
                          local_f0->record_digest[(long)(local_e0->base + -0x23)] =
                               (uint8_t)(uVar32 >> ((byte)local_f8 & 0x3f));
                          local_f0 = (anon_struct_104_5_dae46d3e_for_client *)
                                     ((long)&local_f0->key_share + 1);
                        }
                        iVar18 = (*local_118->commit_message)(local_118);
                        if (iVar18 == 0) {
                          local_148 = lVar30;
                          if (local_140 != (ushort *)0x0) {
                            sVar31 = local_118->buf->off;
                            ppVar13 = tls->key_schedule->hashes[0].algo;
                            sVar25 = ppVar13->digest_size;
                            iVar18 = derive_secret_with_hash
                                               (tls->key_schedule,binder_key,"res binder",
                                                ppVar13->empty_digest);
                            ppVar15 = local_118;
                            if (iVar18 != 0) break;
                            lVar27 = sVar31 - sVar25;
                            local_148 = lVar27 + -3;
                            ptls__key_schedule_update_hash
                                      (tls->key_schedule,local_118->buf->base + lVar30,
                                       local_148 - lVar30);
                            iVar18 = calc_verify_data(ppVar15->buf->base + lVar27,tls->key_schedule,
                                                      binder_key);
                            if (iVar18 != 0) break;
                          }
                          ptls__key_schedule_update_hash
                                    (tls->key_schedule,local_118->buf->base + local_148,
                                     local_118->buf->off - local_148);
                          if (((tls->field_18).server.pending_traffic_secret[0x38] & 2) != 0) {
                            if (ppVar4 != (ptls_key_schedule_t *)0x0) {
                              __assert_fail("!is_second_flight",
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                                            ,0x840,
                                            "int send_client_hello(ptls_t *, ptls_message_emitter_t *, ptls_handshake_properties_t *, ptls_iovec_t *)"
                                           );
                            }
                            iVar18 = setup_traffic_protection(tls,1,"c e traffic",1,0);
                            if ((iVar18 != 0) ||
                               (iVar18 = push_change_cipher_spec(tls,local_118), iVar18 != 0))
                            break;
                          }
                          if ((ppVar4 != (ptls_key_schedule_t *)0x0 || local_140 == (ushort *)0x0)
                             || (iVar18 = derive_exporter_secret(tls,1), iVar18 == 0)) {
                            tls->state = PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO -
                                         (local_d8 == (ptls_iovec_t *)0x0);
                            iVar18 = 0x202;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      break;
    }
  }
  goto LAB_0010afc1;
}

Assistant:

static int send_client_hello(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_handshake_properties_t *properties,
                             ptls_iovec_t *cookie)
{
    ptls_iovec_t resumption_secret = {NULL}, resumption_ticket;
    char *published_sni = NULL;
    uint32_t obfuscated_ticket_age = 0;
    size_t msghash_off;
    uint8_t binder_key[PTLS_MAX_DIGEST_SIZE];
    int ret, is_second_flight = tls->key_schedule != NULL,
             send_sni = tls->server_name != NULL && !ptls_server_name_is_ipaddr(tls->server_name);

    if (properties != NULL) {
        /* try to use ESNI */
        if (!is_second_flight && send_sni && properties->client.esni_keys.base != NULL) {
            if ((ret = client_setup_esni(tls->ctx, &tls->esni, properties->client.esni_keys, &published_sni, tls->client_random)) !=
                0) {
                goto Exit;
            }
            if (tls->ctx->update_esni_key != NULL) {
                if ((ret = tls->ctx->update_esni_key->cb(tls->ctx->update_esni_key, tls, tls->esni->secret,
                                                         tls->esni->client.cipher->hash, tls->esni->esni_contents_hash)) != 0)
                    goto Exit;
            }
        }
        /* setup resumption-related data. If successful, resumption_secret becomes a non-zero value. */
        if (properties->client.session_ticket.base != NULL) {
            ptls_key_exchange_algorithm_t *key_share = NULL;
            ptls_cipher_suite_t *cipher_suite = NULL;
            uint32_t max_early_data_size;
            if (decode_stored_session_ticket(tls, &key_share, &cipher_suite, &resumption_secret, &obfuscated_ticket_age,
                                             &resumption_ticket, &max_early_data_size, properties->client.session_ticket.base,
                                             properties->client.session_ticket.base + properties->client.session_ticket.len) == 0) {
                tls->client.offered_psk = 1;
                /* key-share selected by HRR should not be overridden */
                if (tls->key_share == NULL)
                    tls->key_share = key_share;
                tls->cipher_suite = cipher_suite;
                if (!is_second_flight && max_early_data_size != 0 && properties->client.max_early_data_size != NULL) {
                    tls->client.using_early_data = 1;
                    *properties->client.max_early_data_size = max_early_data_size;
                }
            } else {
                resumption_secret = ptls_iovec_init(NULL, 0);
            }
        }
        if (tls->client.using_early_data) {
            properties->client.early_data_acceptance = PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN;
        } else {
            if (properties->client.max_early_data_size != NULL)
                *properties->client.max_early_data_size = 0;
            properties->client.early_data_acceptance = PTLS_EARLY_DATA_REJECTED;
        }
    }

    /* use the default key share if still not undetermined */
    if (tls->key_share == NULL && !(properties != NULL && properties->client.negotiate_before_key_exchange))
        tls->key_share = tls->ctx->key_exchanges[0];

    if (!is_second_flight) {
        tls->key_schedule = key_schedule_new(tls->cipher_suite, tls->ctx->cipher_suites, tls->ctx->hkdf_label_prefix__obsolete);
        if ((ret = key_schedule_extract(tls->key_schedule, resumption_secret)) != 0)
            goto Exit;
    }

    msghash_off = emitter->buf->off + emitter->record_header_length;
    ptls_push_message(emitter, NULL, PTLS_HANDSHAKE_TYPE_CLIENT_HELLO, {
        ptls_buffer_t *sendbuf = emitter->buf;
        /* legacy_version */
        ptls_buffer_push16(sendbuf, 0x0303);
        /* random_bytes */
        ptls_buffer_pushv(sendbuf, tls->client_random, sizeof(tls->client_random));
        /* lecagy_session_id */
        ptls_buffer_push_block(
            sendbuf, 1, { ptls_buffer_pushv(sendbuf, tls->client.legacy_session_id.base, tls->client.legacy_session_id.len); });
        /* cipher_suites */
        ptls_buffer_push_block(sendbuf, 2, {
            ptls_cipher_suite_t **cs = tls->ctx->cipher_suites;
            for (; *cs != NULL; ++cs)
                ptls_buffer_push16(sendbuf, (*cs)->id);
        });
        /* legacy_compression_methods */
        ptls_buffer_push_block(sendbuf, 1, { ptls_buffer_push(sendbuf, 0); });
        /* extensions */
        ptls_buffer_push_block(sendbuf, 2, {
            struct {
                size_t off;
                size_t len;
            } key_share_client_hello;
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_KEY_SHARE, {
                key_share_client_hello.off = sendbuf->off;
                ptls_buffer_push_block(sendbuf, 2, {
                    if (tls->key_share != NULL) {
                        if ((ret = tls->key_share->create(tls->key_share, &tls->client.key_share_ctx)) != 0)
                            goto Exit;
                        if ((ret = push_key_share_entry(sendbuf, tls->key_share->id, tls->client.key_share_ctx->pubkey)) != 0)
                            goto Exit;
                    }
                });
                key_share_client_hello.len = sendbuf->off - key_share_client_hello.off;
            });
            if (send_sni) {
                if (tls->esni != NULL) {
                    if (published_sni != NULL) {
                        buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SERVER_NAME, {
                            if ((ret = emit_server_name_extension(sendbuf, published_sni)) != 0)
                                goto Exit;
                        });
                    }
                    buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_ENCRYPTED_SERVER_NAME, {
                        if ((ret = emit_esni_extension(tls->esni, sendbuf, properties->client.esni_keys, tls->server_name,
                                                       key_share_client_hello.off, key_share_client_hello.len)) != 0)
                            goto Exit;
                    });
                } else {
                    buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SERVER_NAME, {
                        if ((ret = emit_server_name_extension(sendbuf, tls->server_name)) != 0)
                            goto Exit;
                    });
                }
            }
            if (properties != NULL && properties->client.negotiated_protocols.count != 0) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_ALPN, {
                    ptls_buffer_push_block(sendbuf, 2, {
                        size_t i;
                        for (i = 0; i != properties->client.negotiated_protocols.count; ++i) {
                            ptls_buffer_push_block(sendbuf, 1, {
                                ptls_iovec_t p = properties->client.negotiated_protocols.list[i];
                                ptls_buffer_pushv(sendbuf, p.base, p.len);
                            });
                        }
                    });
                });
            }
            if (tls->ctx->decompress_certificate != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_COMPRESS_CERTIFICATE, {
                    ptls_buffer_push_block(sendbuf, 1, {
                        const uint16_t *algo = tls->ctx->decompress_certificate->supported_algorithms;
                        assert(*algo != UINT16_MAX);
                        for (; *algo != UINT16_MAX; ++algo)
                            ptls_buffer_push16(sendbuf, *algo);
                    });
                });
            }
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SUPPORTED_VERSIONS, {
                ptls_buffer_push_block(sendbuf, 1, {
                    size_t i;
                    for (i = 0; i != PTLS_ELEMENTSOF(supported_versions); ++i)
                        ptls_buffer_push16(sendbuf, supported_versions[i]);
                });
            });
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SIGNATURE_ALGORITHMS, {
                if ((ret = push_signature_algorithms(sendbuf)) != 0)
                    goto Exit;
            });
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SUPPORTED_GROUPS, {
                ptls_key_exchange_algorithm_t **algo = tls->ctx->key_exchanges;
                ptls_buffer_push_block(sendbuf, 2, {
                    for (; *algo != NULL; ++algo)
                        ptls_buffer_push16(sendbuf, (*algo)->id);
                });
            });
            if (cookie != NULL && cookie->base != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_COOKIE, {
                    ptls_buffer_push_block(sendbuf, 2, { ptls_buffer_pushv(sendbuf, cookie->base, cookie->len); });
                });
            }
            if ((ret = push_additional_extensions(properties, sendbuf)) != 0)
                goto Exit;
            if (tls->ctx->save_ticket != NULL || resumption_secret.base != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_PSK_KEY_EXCHANGE_MODES, {
                    ptls_buffer_push_block(sendbuf, 1, {
                        if (!tls->ctx->require_dhe_on_psk)
                            ptls_buffer_push(sendbuf, PTLS_PSK_KE_MODE_PSK);
                        ptls_buffer_push(sendbuf, PTLS_PSK_KE_MODE_PSK_DHE);
                    });
                });
            }
            if (resumption_secret.base != NULL) {
                if (tls->client.using_early_data && !is_second_flight)
                    buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_EARLY_DATA, {});
                /* pre-shared key "MUST be the last extension in the ClientHello" (draft-17 section 4.2.6) */
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_PRE_SHARED_KEY, {
                    ptls_buffer_push_block(sendbuf, 2, {
                        ptls_buffer_push_block(sendbuf, 2,
                                               { ptls_buffer_pushv(sendbuf, resumption_ticket.base, resumption_ticket.len); });
                        ptls_buffer_push32(sendbuf, obfuscated_ticket_age);
                    });
                    /* allocate space for PSK binder. the space is filled at the bottom of the function */
                    ptls_buffer_push_block(sendbuf, 2, {
                        ptls_buffer_push_block(sendbuf, 1, {
                            if ((ret = ptls_buffer_reserve(sendbuf, tls->key_schedule->hashes[0].algo->digest_size)) != 0)
                                goto Exit;
                            sendbuf->off += tls->key_schedule->hashes[0].algo->digest_size;
                        });
                    });
                });
            }
        });
    });

    /* update the message hash, filling in the PSK binder HMAC if necessary */
    if (resumption_secret.base != NULL) {
        size_t psk_binder_off = emitter->buf->off - (3 + tls->key_schedule->hashes[0].algo->digest_size);
        if ((ret = derive_secret_with_empty_digest(tls->key_schedule, binder_key, "res binder")) != 0)
            goto Exit;
        ptls__key_schedule_update_hash(tls->key_schedule, emitter->buf->base + msghash_off, psk_binder_off - msghash_off);
        msghash_off = psk_binder_off;
        if ((ret = calc_verify_data(emitter->buf->base + psk_binder_off + 3, tls->key_schedule, binder_key)) != 0)
            goto Exit;
    }
    ptls__key_schedule_update_hash(tls->key_schedule, emitter->buf->base + msghash_off, emitter->buf->off - msghash_off);

    if (tls->client.using_early_data) {
        assert(!is_second_flight);
        if ((ret = setup_traffic_protection(tls, 1, "c e traffic", 1, 0)) != 0)
            goto Exit;
        if ((ret = push_change_cipher_spec(tls, emitter)) != 0)
            goto Exit;
    }
    if (resumption_secret.base != NULL && !is_second_flight) {
        if ((ret = derive_exporter_secret(tls, 1)) != 0)
            goto Exit;
    }
    tls->state = cookie == NULL ? PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO : PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO;
    ret = PTLS_ERROR_IN_PROGRESS;

Exit:
    if (published_sni != NULL) {
        free(published_sni);
    }
    ptls_clear_memory(binder_key, sizeof(binder_key));
    return ret;
}